

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O0

CSVGuessResult
csv::internals::_guess_format(string_view head,vector<char,_std::allocator<char>_> *delims)

{
  char delim;
  double dVar1;
  CSVGuessResult CVar2;
  undefined8 this;
  bool bVar3;
  const_reference pvVar4;
  reference pcVar5;
  CSVFormat *pCVar6;
  CSVFormat *in_RCX;
  string_view head_00;
  GuessScore GVar7;
  GuessScore result;
  const_iterator cStack_b0;
  char cand_delim;
  const_iterator __end2;
  const_iterator __begin2;
  vector<char,_std::allocator<char>_> *__range2;
  size_t sStack_90;
  char current_delim;
  size_t header;
  size_t max_score;
  CSVFormat format;
  vector<char,_std::allocator<char>_> *delims_local;
  string_view head_local;
  
  head_00._M_len = head._M_str;
  format._80_8_ = delims;
  CSVFormat::CSVFormat((CSVFormat *)&max_score);
  header = 0;
  sStack_90 = 0;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)format._80_8_,0);
  this = format._80_8_;
  __range2._7_1_ = *pvVar4;
  __end2 = std::vector<char,_std::allocator<char>_>::begin
                     ((vector<char,_std::allocator<char>_> *)format._80_8_);
  cStack_b0 = std::vector<char,_std::allocator<char>_>::end
                        ((vector<char,_std::allocator<char>_> *)this);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff50);
    if (!bVar3) break;
    pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&__end2);
    delim = *pcVar5;
    pCVar6 = CSVFormat::delimiter((CSVFormat *)&max_score,delim);
    head_00._M_str = (char *)pCVar6;
    GVar7 = calculate_score((internals *)head._M_len,head_00,in_RCX);
    dVar1 = GVar7.score;
    in_RCX = (CSVFormat *)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f);
    if (header < ((long)dVar1 | (ulong)in_RCX)) {
      in_RCX = (CSVFormat *)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f);
      header = (long)dVar1 | (ulong)in_RCX;
      __range2._7_1_ = delim;
      sStack_90 = GVar7.header;
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&__end2);
  }
  head_local._M_str._0_1_ = __range2._7_1_;
  CSVFormat::~CSVFormat((CSVFormat *)&max_score);
  CVar2.header_row = (int)sStack_90;
  CVar2._0_4_ = head_local._M_str._0_4_;
  return CVar2;
}

Assistant:

CSV_INLINE CSVGuessResult _guess_format(csv::string_view head, const std::vector<char>& delims) {
            /** For each delimiter, find out which row length was most common.
             *  The delimiter with the longest mode row length wins.
             *  Then, the line number of the header row is the first row with
             *  the mode row length.
             */

            CSVFormat format;
            size_t max_score = 0,
                header = 0;
            char current_delim = delims[0];

            for (char cand_delim : delims) {
                auto result = calculate_score(head, format.delimiter(cand_delim));

                if ((size_t)result.score > max_score) {
                    max_score = (size_t)result.score;
                    current_delim = cand_delim;
                    header = result.header;
                }
            }

            return { current_delim, (int)header };
        }